

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_thread.cpp
# Opt level: O0

bool __thiscall FuncThread::RemoveFunc(FuncThread *this,string *name)

{
  bool bVar1;
  _Self local_50 [3];
  _Self local_38;
  iterator iter;
  unique_lock<std::mutex> lock;
  string *name_local;
  FuncThread *this_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&iter,&this->_mutex);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>_>_>
       ::find(&this->_func_map,name);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>_>_>
       ::end(&this->_func_map);
  bVar1 = std::operator!=(&local_38,local_50);
  if (bVar1) {
    std::
    map<std::__cxx11::string,std::function<std::vector<cppnet::Any,std::allocator<cppnet::Any>>(std::vector<cppnet::Any,std::allocator<cppnet::Any>>)>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::vector<cppnet::Any,std::allocator<cppnet::Any>>(std::vector<cppnet::Any,std::allocator<cppnet::Any>>)>>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,std::function<std::vector<cppnet::Any,std::allocator<cppnet::Any>>(std::vector<cppnet::Any,std::allocator<cppnet::Any>>)>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<std::vector<cppnet::Any,std::allocator<cppnet::Any>>(std::vector<cppnet::Any,std::allocator<cppnet::Any>>)>>>>
                        *)&this->_func_map,(iterator)local_38._M_node);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&iter);
  return bVar1;
}

Assistant:

bool FuncThread::RemoveFunc(const std::string& name) {
    std::unique_lock<std::mutex> lock(_mutex);
    auto iter = _func_map.find(name);
    if (iter != _func_map.end()) {
        _func_map.erase(iter);
        return true;
    }
    return false;
}